

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void saucy_search(Abc_Ntk_t *pNtk,saucy *s,int directed,int *colors,saucy_stats *stats)

{
  coloring *c;
  long lVar1;
  int iVar2;
  Vec_Int_t **ppVVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t **ppVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  sim_result *cex;
  saucy_stats *psVar10;
  bool bVar11;
  Abc_Ntk_t *pAVar12;
  int *piVar13;
  int *piVar14;
  char *pcVar15;
  char *pcVar16;
  void *__ptr;
  long lVar17;
  code *pcVar18;
  int iVar19;
  ulong uVar20;
  code *pcVar21;
  uint uVar22;
  int iVar23;
  code *pcVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  int *piVar28;
  size_t __size;
  int iVar29;
  int iVar30;
  int iVar31;
  bool bVar32;
  double dVar33;
  int rmin;
  int target;
  int lmin;
  int local_88;
  int local_84;
  saucy_stats *local_80;
  sim_result *local_78;
  uint local_6c;
  int local_68;
  int local_64;
  int *local_60;
  void **local_58;
  long local_50;
  int *local_48;
  int *local_40;
  sim_result *local_38;
  
  s->pNtk = pNtk;
  local_80 = stats;
  local_60 = colors;
  pAVar12 = Abc_NtkDup(pNtk);
  s->pNtk_permuted = pAVar12;
  ppVVar3 = s->oDep;
  pVVar4 = pNtk->vPos;
  iVar29 = pVVar4->nSize;
  uVar22 = pNtk->vPis->nSize + iVar29;
  __size = 0;
  if (0 < (long)iVar29) {
    lVar17 = 0;
    do {
      __size = (long)(int)__size + (long)ppVVar3[lVar17]->nSize;
      lVar17 = lVar17 + 1;
    } while (iVar29 != lVar17);
    __size = __size * 8;
  }
  ppVVar5 = s->iDep;
  piVar13 = (int *)calloc((long)(int)(uVar22 + 1),4);
  piVar14 = (int *)malloc(__size);
  *piVar13 = 0;
  if (0 < (int)uVar22) {
    uVar20 = 0;
    do {
      lVar17 = (long)piVar13[uVar20];
      if ((long)uVar20 < (long)pVVar4->nSize) {
        pVVar6 = ppVVar3[uVar20];
        iVar29 = pVVar6->nSize;
        lVar25 = iVar29 + lVar17;
        piVar13[uVar20 + 1] = (int)lVar25;
        if (0 < (long)iVar29) {
          lVar27 = 0;
          do {
            if (pVVar6->nSize <= lVar27) {
LAB_002a261e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar14[lVar17 + lVar27] = pVVar4->nSize + pVVar6->pArray[lVar27];
            lVar1 = lVar17 + lVar27;
            lVar27 = lVar27 + 1;
          } while (lVar1 + 1 < lVar25);
        }
      }
      else {
        iVar29 = ppVVar5[(long)(int)uVar20 - (long)pVVar4->nSize]->nSize;
        iVar26 = iVar29 + piVar13[uVar20];
        piVar13[uVar20 + 1] = iVar26;
        if (0 < iVar29) {
          lVar25 = 0;
          do {
            pVVar6 = ppVVar5[(long)(int)uVar20 - (long)pVVar4->nSize];
            if (pVVar6->nSize <= lVar25) goto LAB_002a261e;
            piVar14[lVar17 + lVar25] = pVVar6->pArray[lVar25];
            lVar27 = lVar17 + lVar25;
            lVar25 = lVar25 + 1;
          } while (lVar27 + 1 < (long)iVar26);
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar22);
  }
  s->n = uVar22;
  s->depAdj = piVar13;
  s->depEdg = piVar14;
  s->stats = local_80;
  bVar32 = directed == 0;
  pcVar18 = is_directed_automorphism;
  if (bVar32) {
    pcVar18 = is_undirected_automorphism;
  }
  pcVar21 = ref_singleton_directed;
  if (bVar32) {
    pcVar21 = ref_singleton_undirected;
  }
  pcVar24 = ref_nonsingle_directed;
  if (bVar32) {
    pcVar24 = ref_nonsingle_undirected;
  }
  s->is_automorphism = pcVar18;
  s->ref_singleton = pcVar21;
  s->ref_nonsingle = pcVar24;
  s->indmin = 0;
  s->lev = 1;
  s->anc = 1;
  s->ndiffnons = 0;
  s->nundiffs = 0;
  s->ndiffs = 0;
  s->activityInc = 1.0;
  if (0 < (int)uVar22) {
    piVar13 = s->theta;
    lVar17 = 0;
    do {
      piVar13[lVar17] = (int)lVar17;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  if (0 < s->n) {
    piVar13 = s->gamma;
    lVar17 = 0;
    do {
      piVar13[lVar17] = (int)lVar17;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  if (0 < s->n) {
    piVar13 = s->thsize;
    lVar17 = 0;
    do {
      piVar13[lVar17] = 1;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  if (0 < s->n) {
    piVar13 = s->thnext;
    piVar14 = s->thprev;
    lVar17 = 0;
    do {
      piVar13[lVar17] = (int)lVar17;
      piVar14[lVar17] = (int)lVar17;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  s->npairs = 0;
  if (0 < s->n) {
    piVar13 = s->unpairs;
    lVar17 = 0;
    do {
      piVar13[lVar17] = -1;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  if (0 < s->n) {
    piVar13 = s->undiffnons;
    lVar17 = 0;
    do {
      piVar13[lVar17] = -1;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  local_80->grpsize_base = 1.0;
  uVar22 = 0;
  local_80->grpsize_exp = 0;
  local_80->nodes = 1;
  local_80->support = 0;
  local_80->bads = 0;
  local_80->gens = 0;
  s->nninduce = 0;
  s->nsinduce = 0;
  s->csize = 0;
  if (0 < s->n) {
    piVar13 = s->ccount;
    lVar17 = 0;
    uVar22 = 0;
    do {
      piVar13[local_60[lVar17]] = piVar13[local_60[lVar17]] + 1;
      if ((int)uVar22 <= local_60[lVar17]) {
        uVar22 = local_60[lVar17];
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  s->nsplits = uVar22 + 1;
  piVar13 = (s->left).clen;
  piVar14 = s->ccount;
  *piVar13 = *piVar14 + -1;
  if (0 < (int)uVar22) {
    uVar20 = 0;
    do {
      piVar13[piVar14[uVar20]] = piVar14[uVar20 + 1] + -1;
      piVar14[uVar20 + 1] = piVar14[uVar20 + 1] + piVar14[uVar20];
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  if (0 < s->n) {
    piVar13 = (s->left).lab;
    piVar7 = (s->left).unlab;
    lVar17 = 0;
    do {
      iVar29 = piVar14[local_60[lVar17]];
      iVar26 = iVar29 + -1;
      piVar14[local_60[lVar17]] = iVar26;
      piVar13[(long)iVar29 + -1] = (int)lVar17;
      piVar7[lVar17] = iVar26;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s->n);
  }
  iVar29 = 0;
  memset(piVar14,0,(ulong)uVar22 * 4 + 4);
  if (0 < s->n) {
    do {
      if ((s->left).clen[iVar29] == 0) {
        piVar13 = s->sinduce;
        iVar26 = s->nsinduce;
        s->nsinduce = iVar26 + 1;
      }
      else {
        piVar13 = s->ninduce;
        iVar26 = s->nninduce;
        s->nninduce = iVar26 + 1;
      }
      piVar13[iVar26] = iVar29;
      s->indmark[iVar29] = '\x01';
      iVar26 = (s->left).clen[iVar29];
      if (-1 < iVar26) {
        piVar13 = (s->left).cfront;
        piVar14 = (s->left).lab;
        lVar17 = 0;
        do {
          piVar13[piVar14[iVar29 + lVar17]] = iVar29;
          lVar17 = lVar17 + 1;
        } while (iVar26 + 1 != (int)lVar17);
      }
      iVar29 = iVar29 + (s->left).clen[iVar29] + 1;
    } while (iVar29 < s->n);
  }
  c = &s->left;
  iVar29 = s->n;
  if (iVar29 < 1) {
    iVar26 = -1;
  }
  else {
    piVar13 = (s->left).clen;
    iVar26 = -1;
    iVar19 = 0;
    do {
      if (piVar13[iVar19] != 0) {
        s->prevnon[iVar19] = iVar26;
        s->nextnon[iVar26] = iVar19;
        iVar26 = iVar19;
      }
      iVar19 = piVar13[iVar19] + iVar19 + 1;
      iVar29 = s->n;
    } while (iVar19 < iVar29);
  }
  s->prevnon[iVar29] = iVar26;
  s->nextnon[iVar26] = s->n;
  s->split = split_init;
  s->refineBySim1 = refineBySim1_init;
  s->refineBySim2 = refineBySim2_init;
  printf("Initial Refine by Dependency graph ... ");
  s->adj = s->depAdj;
  s->edg = s->depEdg;
  refine(s,c);
  puts("done!");
  printf("Initial Refine by Simulation ... ");
  puts("done!\n\t--------------------");
  s->refineBySim1 = refineBySim1_left;
  s->refineBySim2 = refineBySim2_left;
  do {
    iVar29 = s->n;
    if (s->nsplits == iVar29) {
      s->splitlev[s->lev] = iVar29;
      break;
    }
    iVar26 = s->pNtk->vPos->nSize;
    if (s->nextnon[-1] < iVar26) {
      iVar29 = iVar26;
      iVar26 = s->nextnon[-1];
    }
    iVar29 = select_smallest_max_connected_cell(s,iVar26,iVar29);
    if (s->fPrintTree != 0) {
      pcVar15 = getVertexName(s->pNtk,(s->left).lab[iVar29]);
      pcVar16 = getVertexName(s->pNtk,(s->left).lab[iVar29]);
      printf("%s->%s\n",pcVar15,pcVar16);
    }
    s->splitvar[s->lev] = (s->left).lab[iVar29];
    s->start[s->lev] = iVar29;
    s->splitlev[s->lev] = s->nsplits;
    iVar29 = descend(s,c,iVar29,iVar29);
  } while (iVar29 != 0);
  s->split = split_other;
  s->refineBySim1 = refineBySim1_other;
  s->refineBySim2 = refineBySim2_other;
  s->anc = s->lev;
  s->stats->levels = s->lev;
  local_80 = (saucy_stats *)&s->right;
  memcpy((s->right).lab,(s->left).lab,(long)s->n << 2);
  memcpy((s->right).unlab,(s->left).unlab,(long)s->n << 2);
  memcpy((s->right).clen,(s->left).clen,(long)s->n << 2);
  memcpy((s->right).cfront,(s->left).cfront,(long)s->n << 2);
  memcpy(s->threp,(s->left).lab,(long)s->n << 2);
  memcpy(s->thfront,(s->left).unlab,(long)s->n << 2);
  s->select_decomposition = select_statically;
  do {
    unprepare_permutation(s);
    if (s->anc < s->lev) {
      s->lev = s->anc + 1;
    }
    iVar29 = s->nsplits;
    iVar19 = backtrack_loop(s);
    iVar26 = s->nsplits;
    s->nsplits = iVar29;
    rewind_coloring(s,c,s->lev + 1);
    s->nsplits = iVar26;
    if ((s->fBooleanMatching != 0) &&
       ((1.0 < s->stats->grpsize_base || (0 < s->stats->grpsize_exp)))) {
      return;
    }
    if (s->fPrintTree == 0) goto LAB_002a1eaf;
    uVar22 = s->lev;
    if ((int)uVar22 < 1) goto LAB_002a1eaf;
    pAVar12 = s->pNtk;
    piVar13 = (s->left).lab;
    iVar29 = s->splitwho[iVar26];
LAB_002a2441:
    pcVar15 = getVertexName(pAVar12,piVar13[iVar29]);
    pcVar16 = getVertexName(s->pNtk,(s->right).lab[iVar19]);
    printf("in level %d: %s->%s\n",(ulong)uVar22,pcVar15,pcVar16);
LAB_002a1eaf:
    if (s->lev == 0) {
      psVar10 = s->stats;
      dVar33 = psVar10->grpsize_base;
      if (10.0 <= dVar33) {
        iVar29 = psVar10->grpsize_exp;
        do {
          dVar33 = dVar33 / 10.0;
          iVar29 = iVar29 + 1;
        } while (10.0 <= dVar33);
        psVar10->grpsize_base = dVar33;
        psVar10->grpsize_exp = iVar29;
        return;
      }
      return;
    }
    iVar29 = s->start[s->lev];
    while( true ) {
      iVar29 = descend(s,(coloring *)local_80,iVar29,iVar19);
      if ((iVar29 == 0) || (s->nsplits != s->splitlev[s->lev])) goto LAB_002a20b1;
      if (s->nsplits == s->n) break;
      (*s->select_decomposition)(s,&local_84,&local_64,&local_88);
      if (s->fPrintTree != 0) {
        uVar22 = s->lev;
        pcVar15 = getVertexName(s->pNtk,(s->left).lab[local_64]);
        pcVar16 = getVertexName(s->pNtk,(s->right).lab[local_88]);
        printf("in level %d: %s->%s\n",(ulong)uVar22,pcVar15,pcVar16);
      }
      s->match = 0;
      s->start[s->lev] = local_84;
      s->split = split_left;
      descend(s,c,local_84,local_64);
      piVar13 = s->splitlev;
      piVar13[s->lev] = s->nsplits;
      s->split = split_other;
      iVar29 = s->lev;
      s->lev = iVar29 + -1;
      s->nsplits = piVar13[(long)iVar29 + -1];
      s->specmin[(long)iVar29 + -1] = (s->right).lab[local_88];
      iVar29 = local_84;
      iVar19 = local_88;
    }
    if (0 < s->ndiffs) {
      piVar13 = (s->right).unlab;
      piVar14 = s->diffs;
      piVar7 = (s->left).lab;
      piVar28 = (s->right).lab;
      piVar8 = s->unsupp;
      piVar9 = s->gamma;
      lVar17 = 0;
      do {
        iVar29 = piVar13[piVar14[lVar17]];
        piVar8[lVar17] = piVar7[iVar29];
        piVar9[piVar7[iVar29]] = piVar28[iVar29];
        lVar17 = lVar17 + 1;
      } while (lVar17 < s->ndiffs);
    }
    prepare_permutation_ntk(s);
    iVar29 = (*s->is_automorphism)(s);
    if (iVar29 == 0) {
      unprepare_permutation(s);
LAB_002a20b1:
      piVar13 = &s->stats->bads;
      *piVar13 = *piVar13 + 1;
      local_50 = (long)s->lev;
      local_68 = backtrack_loop(s);
      local_6c = s->lev;
      do {
        pVVar4 = s->satCounterExamples;
        iVar29 = pVVar4->nSize;
        piVar13 = (int *)(long)iVar29;
        __ptr = calloc((size_t)piVar13,4);
        if (piVar13 == (int *)0x0) {
          bVar32 = false;
        }
        else {
          if (0 < iVar29) {
            local_58 = pVVar4->pArray;
            piVar14 = (int *)0x0;
            do {
              local_48 = piVar14;
              local_78 = (sim_result *)local_58[(long)local_48];
              piVar14 = (int *)0x0;
              do {
                local_60 = piVar13;
                if (*(int *)((long)__ptr + (long)piVar14 * 4) == 0) {
                  cex = (sim_result *)local_58[(long)piVar14];
                  iVar29 = s->pNtk->vPos->nSize;
                  iVar26 = s->pNtk->vPis->nSize;
                  iVar19 = 1;
                  if (0 < iVar26) {
                    lVar17 = (long)iVar29;
                    piVar7 = (s->left).lab;
                    local_40 = (s->right).clen;
                    iVar19 = iVar29;
                    do {
                      iVar23 = local_78->inVec[piVar7[iVar19] - lVar17];
                      iVar31 = local_40[iVar19];
                      iVar30 = iVar19 + 1;
                      if (0 < iVar31) {
                        lVar25 = (long)iVar30 + -1;
                        do {
                          if (iVar23 != local_78->inVec[piVar7[lVar25 + 1] - lVar17]) {
                            iVar19 = -1;
                            goto LAB_002a2220;
                          }
                          lVar25 = lVar25 + 1;
                        } while (lVar25 < iVar31 + iVar19);
                      }
                      iVar2 = cex->inVec[((int *)local_80->grpsize_base)[iVar19] - lVar17];
                      if (0 < iVar31) {
                        lVar25 = (long)iVar30 + -1;
                        do {
                          if (iVar2 != cex->inVec
                                       [((int *)local_80->grpsize_base)[lVar25 + 1] - lVar17])
                          goto LAB_002a221e;
                          lVar25 = lVar25 + 1;
                        } while (lVar25 < iVar31 + iVar19);
                      }
                      if (iVar23 != iVar2) {
LAB_002a221e:
                        iVar19 = 0;
                        goto LAB_002a2220;
                      }
                      iVar19 = iVar31 + iVar30;
                    } while (iVar19 < iVar26 + iVar29);
                    iVar19 = 1;
                  }
LAB_002a2220:
                  local_38 = cex;
                  if (iVar19 != 0) {
                    if (iVar19 == -1) break;
                    if (local_78->outVecOnes != cex->outVecOnes) {
LAB_002a2323:
                      bumpActivity(s,local_78);
                      bumpActivity(s,cex);
                      bVar11 = true;
                      bVar32 = true;
                      goto joined_r0x002a2350;
                    }
                    if ((iVar29 != 1) && (0 < iVar29)) {
                      iVar26 = 0;
                      do {
                        iVar19 = (s->right).clen[iVar26];
                        iVar23 = 0;
                        iVar31 = 0;
                        if (-1 < iVar19) {
                          iVar30 = iVar19 + iVar26;
                          if (iVar19 + iVar26 < iVar26) {
                            iVar30 = iVar26;
                          }
                          lVar17 = 0;
                          iVar31 = 0;
                          iVar23 = 0;
                          do {
                            iVar23 = (iVar23 + 1) -
                                     (uint)(local_78->outVec[c->lab[iVar26 + lVar17]] == 0);
                            iVar31 = (iVar31 + 1) -
                                     (uint)(cex->outVec
                                            [((int *)local_80->grpsize_base)[iVar26 + lVar17]] == 0)
                            ;
                            lVar17 = lVar17 + 1;
                          } while ((iVar30 - iVar26) + 1 != (int)lVar17);
                        }
                        if (iVar23 != iVar31) goto LAB_002a2323;
                        iVar26 = iVar26 + iVar19 + 1;
                      } while (iVar26 < iVar29);
                    }
                  }
                }
                piVar14 = (int *)((long)piVar14 + 1);
              } while (piVar14 != piVar13);
              piVar14 = (int *)((long)local_48 + 1);
            } while ((int *)((long)local_48 + 1) != piVar13);
          }
          bVar11 = false;
          bVar32 = false;
joined_r0x002a2350:
          if (__ptr != (void *)0x0) {
            free(__ptr);
            bVar32 = bVar11;
          }
        }
        if (!bVar32) {
          if ((s->fPrintTree != 0) && (uVar20 = (ulong)(uint)s->lev, s->lev < (int)local_6c))
          goto LAB_002a23a0;
          goto LAB_002a23b2;
        }
        local_68 = backtrack_loop(s);
      } while (s->lev != 0);
      uVar20 = 0;
      if (s->fPrintTree != 0) {
LAB_002a23a0:
        printf("Backtrack by SAT from level %d to %d\n",(ulong)local_6c,uVar20);
      }
LAB_002a23b2:
      iVar19 = -1;
      if (!bVar32) {
        iVar29 = s->nsplits;
        s->nsplits = s->splitlev[local_50];
        rewind_coloring(s,c,s->lev + 1);
        s->nsplits = iVar29;
        iVar19 = local_68;
      }
      if (s->fPrintTree == 0) goto LAB_002a1eaf;
      puts("BAD NODE");
      uVar22 = s->lev;
      if (0 < (int)uVar22) break;
      goto LAB_002a1eaf;
    }
    psVar10 = s->stats;
    piVar13 = &psVar10->gens;
    *piVar13 = *piVar13 + 1;
    iVar29 = s->ndiffs;
    piVar13 = &psVar10->support;
    *piVar13 = *piVar13 + iVar29;
    if (0 < iVar29) {
      piVar13 = s->unsupp;
      piVar14 = s->gamma;
      piVar7 = s->theta;
      lVar17 = 0;
      do {
        iVar29 = piVar13[lVar17];
        iVar26 = iVar29;
        do {
          iVar19 = iVar26;
          iVar26 = piVar7[iVar19];
        } while (iVar19 != piVar7[iVar19]);
        iVar26 = piVar7[iVar29];
        if (iVar26 != iVar19) {
          piVar28 = piVar7 + iVar29;
          do {
            *piVar28 = iVar19;
            piVar28 = piVar7 + iVar26;
            iVar26 = *piVar28;
          } while (iVar26 != iVar19);
        }
        iVar29 = piVar14[iVar29];
        iVar26 = iVar29;
        do {
          iVar23 = iVar26;
          iVar26 = piVar7[iVar23];
        } while (iVar23 != piVar7[iVar23]);
        iVar26 = piVar7[iVar29];
        if (iVar26 != iVar23) {
          piVar28 = piVar7 + iVar29;
          do {
            *piVar28 = iVar23;
            piVar28 = piVar7 + iVar26;
            iVar26 = *piVar28;
          } while (iVar26 != iVar23);
        }
        if (iVar19 != iVar23) {
          iVar29 = iVar23;
          if (iVar19 < iVar23) {
            iVar29 = iVar19;
          }
          if (iVar23 < iVar19) {
            iVar23 = iVar19;
          }
          piVar7[iVar23] = iVar29;
          piVar28 = s->thsize + iVar29;
          *piVar28 = *piVar28 + s->thsize[iVar23];
          piVar28 = s->thnext;
          piVar8 = s->thprev;
          piVar28[piVar8[iVar23]] = piVar28[iVar23];
          piVar8[piVar28[iVar23]] = piVar8[iVar23];
          s->threp[s->thfront[iVar23]] = piVar28[iVar23];
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < s->ndiffs);
    }
    (*s->print_automorphism)(s->gFile,s->n,s->gamma,s->ndiffs,s->unsupp,s->marks,s->pNtk);
    unprepare_permutation(s);
  } while( true );
  pAVar12 = s->pNtk;
  piVar13 = (s->left).lab;
  iVar29 = s->splitwho[s->nsplits];
  goto LAB_002a2441;
}

Assistant:

void
saucy_search(
    Abc_Ntk_t * pNtk,
    struct saucy *s,
    int directed,
    const int *colors,
    struct saucy_stats *stats)
{
    int i, j, max = 0;  
    struct saucy_graph *g;

    extern Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk );

    /* Save network information */
    s->pNtk = pNtk;
    s->pNtk_permuted = Abc_NtkDup( pNtk );  

    /* Builde dependency graph */
    g = buildDepGraph(pNtk, s->iDep, s->oDep);  

    /* Save graph information */
    s->n = g->n;
    s->depAdj = g->adj;
    s->depEdg = g->edg;
    /*s->dadj = g->adj + g->n + 1;
    s->dedg = g->edg + g->e;*/

    /* Save client information */
    s->stats = stats;       

    /* Polymorphism */
    if (directed) {
        s->is_automorphism = is_directed_automorphism;
        s->ref_singleton = ref_singleton_directed;
        s->ref_nonsingle = ref_nonsingle_directed;
    }
    else {
        s->is_automorphism = is_undirected_automorphism;
        s->ref_singleton = ref_singleton_undirected;
        s->ref_nonsingle = ref_nonsingle_undirected;
    }

    /* Initialize scalars */
    s->indmin = 0;  
    s->lev = s->anc = 1;
    s->ndiffs = s->nundiffs = s->ndiffnons = 0;
    s->activityInc = 1;

    /* The initial orbit partition is discrete */
    for (i = 0; i < s->n; ++i) {
        s->theta[i] = i;
    }

    /* The initial permutation is the identity */
    for (i = 0; i < s->n; ++i) {
        s->gamma[i] = i;
    }

    /* Initially every cell of theta has one element */
    for (i = 0; i < s->n; ++i) {
        s->thsize[i] = 1;
    }

    /* Every theta rep list is singleton */
    for (i = 0; i < s->n; ++i) {
        s->thprev[i] = s->thnext[i] = i;
    }

    /* We have no pairs yet */
    s->npairs = 0;
    for (i = 0; i < s->n; ++i) {
        s->unpairs[i] = -1;
    }

    /* Ensure no stray pointers in undiffnons, which is checked by removed_diffnon() */
    for (i = 0; i < s->n; ++i) {
        s->undiffnons[i] = -1;
    }

    /* Initialize stats */
    s->stats->grpsize_base = 1.0;
    s->stats->grpsize_exp = 0;
    s->stats->nodes = 1;
    s->stats->bads = s->stats->gens = s->stats->support = 0;

    /* Prepare for refinement */
    s->nninduce = s->nsinduce = 0;
    s->csize = 0;

    /* Count cell sizes */
    for (i = 0; i < s->n; ++i) {
        s->ccount[colors[i]]++;
        if (max < colors[i]) max = colors[i];
    }
    s->nsplits = max + 1;

    /* Build cell lengths */
    s->left.clen[0] = s->ccount[0] - 1;
    for (i = 0; i < max; ++i) {
        s->left.clen[s->ccount[i]] = s->ccount[i+1] - 1;
        s->ccount[i+1] += s->ccount[i];
    }

    /* Build the label array */
    for (i = 0; i < s->n; ++i) {
        set_label(&s->left, --s->ccount[colors[i]], i);
    }

    /* Clear out ccount */
    for (i = 0; i <= max; ++i) {
        s->ccount[i] = 0;
    }

    /* Update refinement stuff based on initial partition */
    for (i = 0; i < s->n; i += s->left.clen[i]+1) {
        add_induce(s, &s->left, i);
        fix_fronts(&s->left, i, i);
    }

    /* Prepare lists based on cell lengths */
    for (i = 0, j = -1; i < s->n; i += s->left.clen[i] + 1) {
        if (!s->left.clen[i]) continue;
        s->prevnon[i] = j;
        s->nextnon[j] = i;
        j = i;
    }

    /* Fix the end */
    s->prevnon[s->n] = j;
    s->nextnon[j] = s->n;

    /* Preprocessing after initial coloring */
    s->split = split_init;  
    s->refineBySim1 = refineBySim1_init;
    s->refineBySim2 = refineBySim2_init;    

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("Initial Refine by Dependency graph ... ");
    refineByDepGraph(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n");
    
    printf("Initial Refine by Simulation ... ");
    if (REFINE_BY_SIM_1) s->refineBySim1(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2) s->refineBySim2(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n\t--------------------\n");

    /* Descend along the leftmost branch and compute zeta */
    s->refineBySim1 = refineBySim1_left;
    s->refineBySim2 = refineBySim2_left;
    descend_leftmost(s);    
    s->split = split_other; 
    s->refineBySim1 = refineBySim1_other;
    s->refineBySim2 = refineBySim2_other;   

    /* Our common ancestor with zeta is the current level */
    s->stats->levels = s->anc = s->lev;

    /* Copy over this data to our non-leftmost coloring */
    memcpy(s->right.lab, s->left.lab, s->n * sizeof(int));
    memcpy(s->right.unlab, s->left.unlab, s->n * sizeof(int));
    memcpy(s->right.clen, s->left.clen, s->n * sizeof(int));
    memcpy(s->right.cfront, s->left.cfront, s->n * sizeof(int));

    /* The reps are just the labels at this point */
    memcpy(s->threp, s->left.lab, s->n * sizeof(int));
    memcpy(s->thfront, s->left.unlab, s->n * sizeof(int));

    /* choose cell selection method */
    if (SELECT_DYNAMICALLY) s->select_decomposition = select_dynamically;
    else                    s->select_decomposition = select_statically;

    /* Keep running till we're out of automorphisms */
    while (do_search(s));
}